

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

uint16_t __thiscall double_conversion::Bignum::DivideModuloIntBignum(Bignum *this,Bignum *other)

{
  short sVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint factor;
  ushort uVar6;
  uint16_t uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  
  if ((int)this->exponent_ + (int)this->used_bigits_ <
      (int)other->exponent_ + (int)other->used_bigits_) {
    uVar7 = 0;
  }
  else {
    Align(this,other);
    uVar6 = this->used_bigits_;
    iVar5 = (int)(short)uVar6;
    iVar10 = this->exponent_ + iVar5;
    sVar1 = other->used_bigits_;
    iVar9 = (int)sVar1;
    iVar8 = 0;
    iVar11 = other->exponent_ + iVar9;
    while (iVar11 < iVar10) {
      iVar8 = iVar8 + this->bigits_buffer_[(long)iVar5 + -1];
      SubtractTimes(this,other,this->bigits_buffer_[(long)iVar5 + -1]);
      uVar6 = this->used_bigits_;
      iVar5 = (int)(short)uVar6;
      iVar10 = this->exponent_ + iVar5;
      sVar1 = other->used_bigits_;
      iVar9 = (int)sVar1;
      iVar11 = other->exponent_ + iVar9;
    }
    uVar2 = this->bigits_buffer_[(long)iVar5 + -1];
    uVar3 = other->bigits_buffer_[(long)iVar9 + -1];
    if (sVar1 == 1) {
      this->bigits_buffer_[(long)iVar5 + -1] = uVar2 % uVar3;
      uVar7 = (short)iVar8 + (short)(uVar2 / uVar3);
      if ((short)uVar6 < 1) {
        if (uVar6 != 0) {
          return uVar7;
        }
      }
      else {
        do {
          if (this->bigits_buffer_[uVar6 - 1] != 0) {
            return uVar7;
          }
          this->used_bigits_ = uVar6 - 1;
          bVar4 = 1 < (short)uVar6;
          uVar6 = uVar6 - 1;
        } while (bVar4);
      }
      this->exponent_ = 0;
    }
    else {
      factor = uVar2 / (uVar3 + 1);
      iVar8 = iVar8 + factor;
      uVar7 = (uint16_t)iVar8;
      SubtractTimes(this,other,factor);
      if ((factor + 1) * uVar3 <= uVar2) {
        while( true ) {
          uVar7 = (uint16_t)iVar8;
          iVar5 = Compare(other,this);
          if (0 < iVar5) break;
          SubtractBignum(this,other);
          iVar8 = iVar8 + 1;
        }
      }
    }
  }
  return uVar7;
}

Assistant:

void Bignum::AssignHexString(Vector<const char> value) {
  Zero();
  // Required capacity could be reduced by ignoring leading zeros.
  EnsureCapacity(((value.length() * 4) + kBigitSize - 1) / kBigitSize);
  DOUBLE_CONVERSION_ASSERT(sizeof(uint64_t) * 8 >= kBigitSize + 4);  // TODO: static_assert
  // Accumulates converted hex digits until at least kBigitSize bits.
  // Works with non-factor-of-four kBigitSizes.
  uint64_t tmp = 0;  // Accumulates converted hex digits until at least
  for (int cnt = 0; !value.is_empty(); value.pop_back()) {
    tmp |= (HexCharValue(value.last()) << cnt);
    if ((cnt += 4) >= kBigitSize) {
      RawBigit(used_bigits_++) = (tmp & kBigitMask);
      cnt -= kBigitSize;
      tmp >>= kBigitSize;
    }
  }
  if (tmp > 0) {
    RawBigit(used_bigits_++) = tmp;
  }
  Clamp();
}